

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall
QTextCursor::insertBlock(QTextCursor *this,QTextBlockFormat *format,QTextCharFormat *_charFormat)

{
  bool bVar1;
  QTextCursorPrivate *pQVar2;
  QTextDocumentPrivate *in_RDX;
  char *__filename;
  QTextCharFormat *in_RDI;
  long in_FS_OFFSET;
  QTextCursorPrivate *unaff_retaddr;
  QTextCharFormat charFormat;
  QTextCursorPrivate *this_00;
  QTextCharFormat *charFormat_00;
  QTextBlockFormat *format_00;
  
  format_00 = *(QTextBlockFormat **)(in_FS_OFFSET + 0x28);
  bVar1 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a5a23);
  if ((!bVar1) &&
     (pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)in_RDX),
     pQVar2->priv != (QTextDocumentPrivate *)0x0)) {
    this_00 = (QTextCursorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    charFormat_00 = (QTextCharFormat *)&DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)in_RDX,in_RDI);
    __filename = (char *)0x0;
    QTextFormat::clearProperty((QTextFormat *)in_RDX,(int)((ulong)in_RDI >> 0x20));
    pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)in_RDX);
    QTextDocumentPrivate::beginEditBlock(pQVar2->priv);
    pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)in_RDX);
    QTextCursorPrivate::remove(pQVar2,__filename);
    QSharedDataPointer<QTextCursorPrivate>::operator->
              ((QSharedDataPointer<QTextCursorPrivate> *)in_RDX);
    QTextCursorPrivate::insertBlock(unaff_retaddr,format_00,charFormat_00);
    QSharedDataPointer<QTextCursorPrivate>::operator->
              ((QSharedDataPointer<QTextCursorPrivate> *)in_RDX);
    QTextDocumentPrivate::endEditBlock(in_RDX);
    QSharedDataPointer<QTextCursorPrivate>::operator->
              ((QSharedDataPointer<QTextCursorPrivate> *)in_RDX);
    QTextCursorPrivate::setX(this_00);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7a5ada);
  }
  if (*(QTextBlockFormat **)(in_FS_OFFSET + 0x28) != format_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextCursor::insertBlock(const QTextBlockFormat &format, const QTextCharFormat &_charFormat)
{
    if (!d || !d->priv)
        return;

    QTextCharFormat charFormat = _charFormat;
    charFormat.clearProperty(QTextFormat::ObjectIndex);

    d->priv->beginEditBlock();
    d->remove();
    d->insertBlock(format, charFormat);
    d->priv->endEditBlock();
    d->setX();
}